

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall
cmFindPackageCommand::LoadPackageRegistryDir
          (cmFindPackageCommand *this,string *dir,cmSearchPath *outPaths)

{
  bool bVar1;
  Status SVar2;
  unsigned_long uVar3;
  char *__s;
  ulong dindex;
  cmFindPackageCommand *this_00;
  _Alloc_hider this_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  Directory files;
  string fname;
  string fentry;
  ifstream fin;
  Directory local_2c0;
  string local_2b8;
  undefined1 local_298 [56];
  cmSearchPath *local_260;
  string local_258;
  pointer local_238;
  pointer local_230;
  pointer local_228;
  pointer local_220;
  pointer local_218;
  pointer local_210;
  _Alloc_hider local_208;
  char *local_200;
  undefined8 local_1f8;
  
  local_260 = outPaths;
  cmsys::Directory::Directory(&local_2c0);
  SVar2 = cmsys::Directory::Load(&local_2c0,dir,(string *)0x0);
  if (SVar2.Kind_ == Success) {
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    local_2b8._M_string_length = 0;
    local_2b8.field_2._M_local_buf[0] = '\0';
    dindex = 0;
    while( true ) {
      uVar3 = cmsys::Directory::GetNumberOfFiles(&local_2c0);
      if (uVar3 <= dindex) break;
      __s = cmsys::Directory::GetFile(&local_2c0,dindex);
      local_230 = (pointer)(dir->_M_dataplus)._M_p;
      local_238 = (pointer)dir->_M_string_length;
      local_228 = (pointer)0x0;
      local_298._0_8_ = (pointer)0x0;
      local_298._8_8_ = 1;
      local_298._16_8_ = local_298 + 0x18;
      local_298[0x18] = '/';
      local_220 = (pointer)0x1;
      local_210 = (pointer)0x0;
      local_218 = (pointer)local_298._16_8_;
      local_208._M_p = (pointer)strlen(__s);
      local_1f8 = 0;
      views._M_len = 3;
      views._M_array = (iterator)&stack0xfffffffffffffdc8;
      local_200 = __s;
      cmCatViews(&local_258,views);
      std::__cxx11::string::operator=((string *)&local_2b8,(string *)&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      bVar1 = cmsys::SystemTools::FileIsDirectory(&local_2b8);
      this_01._M_p = local_2b8._M_dataplus._M_p;
      if (!bVar1) {
        std::ifstream::ifstream
                  ((cmFindPackageCommand *)&stack0xfffffffffffffdc8,local_2b8._M_dataplus._M_p,
                   _S_in|_S_bin);
        local_298._0_8_ = local_298 + 0x10;
        local_298._8_8_ = 0;
        local_298._16_8_ = local_298._16_8_ & 0xffffffffffffff00;
        if ((*(byte *)((long)&stack0xfffffffffffffde8 + local_238[-1]._M_string_length) & 5) == 0) {
          this_00 = (cmFindPackageCommand *)&stack0xfffffffffffffdc8;
          bVar1 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)&stack0xfffffffffffffdc8,(string *)local_298,(bool *)0x0,
                             0xffffffffffffffff);
          if (bVar1) {
            bVar1 = CheckPackageRegistryEntry(this_00,(string *)local_298,local_260);
            if (bVar1) {
              this_01._M_p = (pointer)0x0;
            }
          }
        }
        if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
          operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
        }
        std::ifstream::~ifstream((cmFindPackageCommand *)&stack0xfffffffffffffdc8);
        anon_unknown.dwarf_5ef40b::cmFindPackageCommandHoldFile::~cmFindPackageCommandHoldFile
                  ((cmFindPackageCommandHoldFile *)this_01._M_p);
      }
      dindex = dindex + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,
                      CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                               local_2b8.field_2._M_local_buf[0]) + 1);
    }
  }
  cmsys::Directory::~Directory(&local_2c0);
  return;
}

Assistant:

void cmFindPackageCommand::LoadPackageRegistryDir(std::string const& dir,
                                                  cmSearchPath& outPaths)
{
  cmsys::Directory files;
  if (!files.Load(dir)) {
    return;
  }

  std::string fname;
  for (unsigned long i = 0; i < files.GetNumberOfFiles(); ++i) {
    fname = cmStrCat(dir, '/', files.GetFile(i));

    if (!cmSystemTools::FileIsDirectory(fname)) {
      // Hold this file hostage until it behaves.
      cmFindPackageCommandHoldFile holdFile(fname.c_str());

      // Load the file.
      cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);
      std::string fentry;
      if (fin && cmSystemTools::GetLineFromStream(fin, fentry) &&
          this->CheckPackageRegistryEntry(fentry, outPaths)) {
        // The file references an existing package, so release it.
        holdFile.Release();
      }
    }
  }

  // TODO: Wipe out the directory if it is empty.
}